

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngread.c
# Opt level: O1

void set_file_encoding(png_image_read_control *display)

{
  int iVar1;
  png_fixed_point pVar2;
  
  pVar2 = (display->image->opaque->png_ptr->colorspace).gamma;
  iVar1 = png_gamma_significant(pVar2);
  if (iVar1 != 0) {
    if ((pVar2 < 100000) &&
       ((pVar2 == 0 || (iVar1 = png_gamma_significant((pVar2 * 0xb + 2) / 5), iVar1 == 0)))) {
      display->file_encoding = 1;
    }
    else {
      display->file_encoding = 3;
      pVar2 = png_reciprocal(pVar2);
      display->gamma_to_linear = pVar2;
    }
    return;
  }
  display->file_encoding = 4;
  return;
}

Assistant:

static void
set_file_encoding(png_image_read_control *display)
{
   png_fixed_point g = display->image->opaque->png_ptr->colorspace.gamma;
   if (png_gamma_significant(g) != 0)
   {
      if (png_gamma_not_sRGB(g) != 0)
      {
         display->file_encoding = P_FILE;
         display->gamma_to_linear = png_reciprocal(g);
      }

      else
         display->file_encoding = P_sRGB;
   }

   else
      display->file_encoding = P_LINEAR8;
}